

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void vfmadd132ss_(PDISASM pMyDisasm)

{
  UInt8 UVar1;
  
  if ((pMyDisasm->Prefix).OperandSize != '\x01') {
failDecode:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
  (pMyDisasm->Prefix).OperandSize = '\b';
  UVar1 = (pMyDisasm->Reserved_).EVEX.state;
  if (UVar1 == '\x01') {
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
  }
  if ((pMyDisasm->Reserved_).VEX.state != '\x01') goto failDecode;
  if ((pMyDisasm->Reserved_).REX.W_ == '\0') {
    if (UVar1 != '\x01') goto LAB_0012a1bd;
  }
  else if (UVar1 != '\x01') goto LAB_0012a1a0;
  if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
LAB_0012a1bd:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vfmadd132ss",0xc);
    ArgsVEX(pMyDisasm);
    return;
  }
LAB_0012a1a0:
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vfmadd132sd",0xc);
  ArgsVEX(pMyDisasm);
  return;
}

Assistant:

void __bea_callspec__ vfmadd132ss_(PDISASM pMyDisasm)
{
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = TUPLE1_SCALAR;
       if (GV.VEX.state == InUsePrefix) {
         if (((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) || ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))) {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmadd132ss");
           #endif
         } else {
           #ifndef BEA_LIGHT_DISASSEMBLY
              (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vfmadd132sd");
           #endif

         }
         ArgsVEX(pMyDisasm);
       } else {
         failDecode(pMyDisasm);
       }
   }
   else {
       failDecode(pMyDisasm);
   }
}